

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonDom.cc
# Opt level: O3

string * __thiscall
avro::json::Entity::toString_abi_cxx11_(string *__return_storage_ptr__,Entity *this)

{
  OutputStream *pOVar1;
  char cVar2;
  long lVar3;
  auto_ptr<avro::OutputStream> out;
  size_t n;
  auto_ptr<avro::InputStream> in2;
  auto_ptr<avro::InputStream> in;
  uint8_t *p;
  JsonGenerator g;
  OutputStream *local_d0;
  size_t local_c8;
  long *local_c0;
  long *local_b8;
  void *local_b0;
  JsonGenerator local_a8;
  
  memoryOutputStream((avro *)&local_d0,0x1000);
  local_a8.stateStack.c.
  super__Deque_base<avro::json::JsonGenerator::State,_std::allocator<avro::json::JsonGenerator::State>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_a8.stateStack.c.
  super__Deque_base<avro::json::JsonGenerator::State,_std::allocator<avro::json::JsonGenerator::State>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_a8.stateStack.c.
  super__Deque_base<avro::json::JsonGenerator::State,_std::allocator<avro::json::JsonGenerator::State>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_a8.stateStack.c.
  super__Deque_base<avro::json::JsonGenerator::State,_std::allocator<avro::json::JsonGenerator::State>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_a8.stateStack.c.
  super__Deque_base<avro::json::JsonGenerator::State,_std::allocator<avro::json::JsonGenerator::State>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_a8.stateStack.c.
  super__Deque_base<avro::json::JsonGenerator::State,_std::allocator<avro::json::JsonGenerator::State>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_a8.stateStack.c.
  super__Deque_base<avro::json::JsonGenerator::State,_std::allocator<avro::json::JsonGenerator::State>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_a8.stateStack.c.
  super__Deque_base<avro::json::JsonGenerator::State,_std::allocator<avro::json::JsonGenerator::State>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_a8.out_.end_ = (uint8_t *)0x0;
  local_a8.stateStack.c.
  super__Deque_base<avro::json::JsonGenerator::State,_std::allocator<avro::json::JsonGenerator::State>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8.out_.out_ = (OutputStream *)0x0;
  local_a8.out_.next_ = (uint8_t *)0x0;
  local_a8.stateStack.c.
  super__Deque_base<avro::json::JsonGenerator::State,_std::allocator<avro::json::JsonGenerator::State>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<avro::json::JsonGenerator::State,_std::allocator<avro::json::JsonGenerator::State>_>::
  _M_initialize_map((_Deque_base<avro::json::JsonGenerator::State,_std::allocator<avro::json::JsonGenerator::State>_>
                     *)&local_a8.stateStack,0);
  pOVar1 = local_d0;
  local_a8.top = stStart;
  if ((local_a8.out_.out_ != (OutputStream *)0x0) && (local_a8.out_.end_ != local_a8.out_.next_)) {
    (*(local_a8.out_.out_)->_vptr_OutputStream[3])();
  }
  local_a8.out_.out_ = pOVar1;
  local_a8.out_.next_ = local_a8.out_.end_;
  writeEntity(&local_a8,this);
  if (local_a8.out_.next_ != local_a8.out_.end_) {
    (*(local_a8.out_.out_)->_vptr_OutputStream[3])
              (local_a8.out_.out_,(long)local_a8.out_.end_ - (long)local_a8.out_.next_);
    local_a8.out_.next_ = local_a8.out_.end_;
  }
  (*(local_a8.out_.out_)->_vptr_OutputStream[5])();
  memoryInputStream((avro *)&local_b8,local_d0);
  lVar3 = 0;
  local_b0 = (void *)0x0;
  local_c8 = 0;
  while( true ) {
    cVar2 = (**(code **)(*local_b8 + 0x10))(local_b8,&local_b0,&local_c8);
    if (cVar2 == '\0') break;
    lVar3 = lVar3 + local_c8;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)lVar3);
  memoryInputStream((avro *)&local_c0,local_d0);
  lVar3 = 0;
  while( true ) {
    cVar2 = (**(code **)(*local_c0 + 0x10))(local_c0,&local_b0,&local_c8);
    if (cVar2 == '\0') break;
    memcpy((__return_storage_ptr__->_M_dataplus)._M_p + lVar3,local_b0,local_c8);
    lVar3 = lVar3 + local_c8;
  }
  if (local_c0 != (long *)0x0) {
    (**(code **)(*local_c0 + 8))();
  }
  if (local_b8 != (long *)0x0) {
    (**(code **)(*local_b8 + 8))();
  }
  std::
  _Deque_base<avro::json::JsonGenerator::State,_std::allocator<avro::json::JsonGenerator::State>_>::
  ~_Deque_base((_Deque_base<avro::json::JsonGenerator::State,_std::allocator<avro::json::JsonGenerator::State>_>
                *)&local_a8.stateStack);
  if (local_d0 != (OutputStream *)0x0) {
    (*local_d0->_vptr_OutputStream[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Entity::toString() const
{
    std::auto_ptr<OutputStream> out = memoryOutputStream();
    JsonGenerator g;
    g.init(*out);
    writeEntity(g, *this);
    g.flush();
    std::auto_ptr<InputStream> in = memoryInputStream(*out);
    const uint8_t *p = 0;
    size_t n = 0;
    size_t c = 0;
    while (in->next(&p, &n)) {
        c += n;
    }
    std::string result;
    result.resize(c);
    c = 0;
    std::auto_ptr<InputStream> in2 = memoryInputStream(*out);
    while (in2->next(&p, &n)) {
        ::memcpy(&result[c], p, n);
        c += n;
    }
    return result;
}